

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncryptionOperator.cpp
# Opt level: O2

void __thiscall adios2::plugin::EncryptionOperator::EncryptImpl::~EncryptImpl(EncryptImpl *this)

{
  sodium_munlock(this->Key,0x20);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~EncryptImpl()
    {
        // unlocks the memory location as well as zeroing out the data
        sodium_munlock(Key, crypto_secretbox_KEYBYTES);
    }